

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_table_info.cpp
# Opt level: O1

void duckdb::PragmaShowHelper::GetTableColumns
               (ColumnDefinition *column,ColumnConstraintInfo constraint_info,DataChunk *output,
               idx_t index)

{
  pointer pcVar1;
  string *psVar2;
  LogicalType *this;
  char *pcVar3;
  Value key;
  Value local_120;
  LogicalType local_e0;
  Value local_c8;
  LogicalType local_88;
  string local_70;
  string local_50;
  
  psVar2 = ColumnDefinition::Name_abi_cxx11_(column);
  pcVar1 = (psVar2->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + psVar2->_M_string_length);
  Value::Value(&local_120,&local_70);
  DataChunk::SetValue(output,0,index,&local_120);
  Value::~Value(&local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  this = ColumnDefinition::Type(column);
  LogicalType::ToString_abi_cxx11_(&local_50,this);
  Value::Value(&local_120,&local_50);
  DataChunk::SetValue(output,1,index,&local_120);
  Value::~Value(&local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  pcVar3 = "YES";
  if (((uint3)constraint_info & 1) != 0) {
    pcVar3 = "NO";
  }
  Value::Value(&local_120,pcVar3);
  DataChunk::SetValue(output,2,index,&local_120);
  Value::~Value(&local_120);
  LogicalType::LogicalType(&local_88,SQLNULL);
  Value::Value(&local_120,&local_88);
  LogicalType::~LogicalType(&local_88);
  if (((uint3)constraint_info >> 8 & 1) == 0) {
    if (((uint3)constraint_info >> 0x10 & 1) == 0) goto LAB_0153dd72;
    pcVar3 = "UNI";
  }
  else {
    pcVar3 = "PRI";
  }
  Value::Value(&local_c8,pcVar3);
  Value::operator=(&local_120,&local_c8);
  Value::~Value(&local_c8);
LAB_0153dd72:
  DataChunk::SetValue(output,3,index,&local_120);
  DefaultValue(&local_c8,column);
  DataChunk::SetValue(output,4,index,&local_c8);
  Value::~Value(&local_c8);
  LogicalType::LogicalType(&local_e0,SQLNULL);
  Value::Value(&local_c8,&local_e0);
  DataChunk::SetValue(output,5,index,&local_c8);
  Value::~Value(&local_c8);
  LogicalType::~LogicalType(&local_e0);
  Value::~Value(&local_120);
  return;
}

Assistant:

static void GetTableColumns(const ColumnDefinition &column, ColumnConstraintInfo constraint_info, DataChunk &output,
	                            idx_t index) {
		// "column_name", PhysicalType::VARCHAR
		output.SetValue(0, index, Value(column.Name()));
		// "column_type", PhysicalType::VARCHAR
		output.SetValue(1, index, Value(column.Type().ToString()));
		// "null", PhysicalType::VARCHAR
		output.SetValue(2, index, Value(constraint_info.not_null ? "NO" : "YES"));
		// "key", PhysicalType::VARCHAR
		Value key;
		if (constraint_info.pk || constraint_info.unique) {
			key = Value(constraint_info.pk ? "PRI" : "UNI");
		}
		output.SetValue(3, index, key);
		// "default", VARCHAR
		output.SetValue(4, index, DefaultValue(column));
		// "extra", VARCHAR
		output.SetValue(5, index, Value());
	}